

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

ostream * Logger::Start(LogSeverity severity,string *file,int line,string *function)

{
  ostream *poVar1;
  time_t tm;
  char time_string [128];
  time_t local_c0;
  char local_b8 [136];
  
  time(&local_c0);
  ctime_r(&local_c0,local_b8);
  poVar1 = GetStream(severity);
  poVar1 = std::operator<<(poVar1,local_b8);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)file);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,line);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = std::operator<<(poVar1,(string *)function);
  std::operator<<(poVar1,") ");
  poVar1 = (ostream *)std::ostream::flush();
  return poVar1;
}

Assistant:

std::ostream& Logger::Start(LogSeverity severity,
                            const std::string& file,
                            int line,
                            const std::string& function) {
  time_t tm;
  time(&tm);
  char time_string[128];
#ifndef _MSC_VER
  ctime_r(&tm, time_string);
#else
  ctime_s(time_string, sizeof(time_string), &tm);
#endif
  return GetStream(severity) << time_string
                             << " " << file << ":" << line
                             << " (" << function << ") " << std::flush;
}